

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

int __thiscall
pstore::brokerface::channel<std::condition_variable>::remove
          (channel<std::condition_variable> *this,char *__filename)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  int iVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  _Hash_node_base *local_10;
  
  local_10 = (_Hash_node_base *)__filename;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  uVar1 = (this->subscribers_)._M_h._M_bucket_count;
  uVar4 = (ulong)local_10 % uVar1;
  p_Var5 = (this->subscribers_)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_10 != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, local_10 == p_Var2[1]._M_nxt)) goto LAB_001174d3;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_001174d3:
  if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
    std::
    _Hashtable<pstore::brokerface::subscriber<std::condition_variable>_*,_pstore::brokerface::subscriber<std::condition_variable>_*,_std::allocator<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Identity,_std::equal_to<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::hash<pstore::brokerface::subscriber<std::condition_variable>_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::_M_erase(&(this->subscribers_)._M_h,&local_10);
    iVar3 = pthread_mutex_unlock((pthread_mutex_t *)this);
    return iVar3;
  }
  assert_failed("subscribers_.find (sub) != subscribers_.end ()",
                "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/brokerface/pubsub.hpp"
                ,0x130);
}

Assistant:

void channel<ConditionVariable>::remove (subscriber_type * sub) noexcept {
            std::lock_guard<std::mutex> const lock{mut_};
            PSTORE_ASSERT (subscribers_.find (sub) != subscribers_.end ());
            subscribers_.erase (sub);
        }